

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_gga_inc.c
# Opt level: O1

void work_gga_vxc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,xc_gga_out_params *out)

{
  double *pdVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double __x;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double __x_00;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double __x_01;
  double dVar98;
  double dVar99;
  double dVar100;
  double __x_02;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double __x_03;
  double dVar113;
  double dVar114;
  double __x_04;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double __x_05;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  undefined1 auVar133 [16];
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double __x_06;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar284;
  double dVar285;
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  double dVar291;
  double dVar292;
  double dVar293;
  double dVar294;
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  double dVar305;
  double dVar306;
  double dVar307;
  double dVar308;
  double dVar309;
  double dVar310;
  double dVar311;
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  double dVar318;
  double dVar319;
  double dVar320;
  double dVar321;
  double dVar322;
  double dVar323;
  double local_f08;
  double local_ef8;
  double local_ee8;
  double local_e80;
  double local_d60;
  undefined8 local_aa8;
  double local_a78;
  uint local_a38;
  uint uStack_a34;
  double local_9e0;
  double local_6a8;
  double local_698;
  double local_4e0;
  double local_128;
  
  if (np != 0) {
    sVar9 = 0;
    local_4e0 = 0.0;
    local_e80 = 0.0;
    do {
      if (p->nspin == 2) {
        lVar7 = (long)(p->dim).rho * sVar9;
        dVar19 = rho[lVar7] + rho[lVar7 + 1];
      }
      else {
        dVar19 = rho[(long)(p->dim).rho * sVar9];
      }
      dVar234 = p->dens_threshold;
      if (dVar234 <= dVar19) {
        lVar7 = (long)(p->dim).rho * sVar9;
        lVar8 = (long)(p->dim).sigma * sVar9;
        dVar19 = rho[lVar7];
        if (rho[lVar7] <= dVar234) {
          dVar19 = dVar234;
        }
        dVar20 = p->sigma_threshold * p->sigma_threshold;
        dVar29 = sigma[lVar8];
        if (sigma[lVar8] <= dVar20) {
          dVar29 = dVar20;
        }
        if (p->nspin == 2) {
          local_e80 = rho[lVar7 + 1];
          if (rho[lVar7 + 1] <= dVar234) {
            local_e80 = dVar234;
          }
          local_4e0 = sigma[lVar8 + 2];
          if (sigma[lVar8 + 2] <= dVar20) {
            local_4e0 = dVar20;
          }
        }
        __x_06 = dVar19 + local_e80;
        dVar179 = 1.0 / __x_06;
        dVar235 = (dVar19 + dVar19) * dVar179;
        dVar20 = p->zeta_threshold;
        dVar246 = dVar20 + -1.0;
        dVar199 = (local_e80 + local_e80) * dVar179;
        dVar267 = -dVar246;
        dVar134 = dVar19 - local_e80;
        dVar135 = dVar134 * dVar179;
        uVar10 = -(ulong)(dVar199 <= dVar20);
        uVar11 = -(ulong)(dVar235 <= dVar20);
        dVar136 = (double)(uVar11 & (ulong)dVar246 |
                          ~uVar11 & (uVar10 & (ulong)dVar267 | ~uVar10 & (ulong)dVar135)) + 1.0;
        dVar21 = cbrt(dVar20);
        dVar22 = cbrt(dVar136);
        dVar23 = cbrt(__x_06);
        dVar24 = p->cam_omega * 2.080083823051904;
        auVar178._0_8_ = cbrt(9.869604401089358);
        uVar12 = -(ulong)(1.0 - dVar135 <= dVar20);
        uVar13 = -(ulong)(dVar135 + 1.0 <= dVar20);
        dVar25 = (double)(~uVar13 & (uVar12 & (ulong)dVar267 | ~uVar12 & (ulong)dVar135) |
                         uVar13 & (ulong)dVar246) + 1.0;
        dVar26 = cbrt(dVar25);
        uVar14 = -(ulong)(dVar25 <= dVar20);
        dVar89 = (double)(uVar14 & (ulong)dVar21 | ~uVar14 & (ulong)dVar26);
        auVar178._8_8_ = dVar89;
        auVar177 = divpd(_DAT_00f6f930,auVar178);
        dVar198 = auVar177._0_8_;
        dVar25 = 1.0 / dVar23;
        dVar94 = auVar177._8_8_ * dVar198 * dVar24;
        dVar27 = (dVar25 * dVar94) / 3.0;
        dVar28 = dVar198 * 3.3019272488946267;
        if (dVar29 < 0.0) {
          dVar29 = sqrt(dVar29);
        }
        else {
          dVar29 = SQRT(dVar29);
        }
        dVar30 = cbrt(dVar19);
        dVar31 = (1.0 / dVar30) / dVar19;
        dVar95 = (dVar28 * dVar29 * dVar31) / 12.0;
        dVar32 = 15.0;
        if (dVar95 <= 15.0) {
          dVar32 = dVar95;
        }
        dVar33 = dVar32;
        if (dVar32 <= 1.0) {
          dVar33 = 1.0;
        }
        dVar34 = exp(dVar33 + -8.572844);
        dVar35 = log(dVar34 + 1.0);
        uVar15 = -(ulong)(15.0 < dVar95);
        uVar16 = -(ulong)(dVar95 < 1.0);
        dVar35 = (double)(~uVar16 & (uVar15 & 0x4021254bcf0b6b6e |
                                    ~uVar15 & (ulong)(dVar33 - dVar35)) | uVar16 & (ulong)dVar95);
        dVar33 = 1e-15;
        if (1e-15 <= dVar35) {
          dVar33 = dVar35;
        }
        dVar96 = dVar33 * dVar33;
        dVar222 = dVar96 * dVar96;
        dVar180 = dVar96 * 0.00979681 + dVar222 * 0.0410834;
        dVar137 = dVar96 * dVar180;
        dVar181 = dVar96 * dVar222 * 0.0347188 +
                  dVar33 * dVar222 * 0.00120824 + dVar222 * 0.18744 + 1.0;
        dVar36 = 1.0 / dVar181;
        dVar138 = dVar137 * dVar36;
        dVar97 = 1.0 / (auVar178._0_8_ * auVar178._0_8_);
        dVar139 = 1.0 / (dVar23 * dVar23);
        dVar200 = dVar138 * 2.214317600459161;
        dVar37 = p->cam_omega * p->cam_omega;
        dVar182 = (double)(~-(ulong)(dVar27 < 14.0) & 0x4000000000000000 |
                          -(ulong)(dVar27 < 14.0) & 0x3ff74b6dffbb791d) * dVar37 *
                  1.4422495703074083;
        dVar201 = dVar89 * dVar89;
        dVar38 = 1.0 / dVar201;
        dVar140 = dVar139 * dVar97 * dVar38;
        dVar39 = dVar140 * dVar182 * 0.7381058668197203 + dVar200;
        dVar40 = xc_expint_e1_impl(dVar39,1);
        dVar41 = (dVar140 * dVar182) / 3.0;
        __x_01 = dVar138 + 0.57786348;
        dVar42 = dVar41 + __x_01;
        dVar43 = log(dVar42);
        dVar41 = dVar41 + dVar138;
        dVar44 = log(dVar41);
        dVar294 = 14.0;
        if (dVar27 <= 14.0) {
          dVar294 = dVar27;
        }
        dVar141 = dVar294 * dVar294;
        dVar98 = dVar294 * dVar141;
        dVar45 = dVar141 * dVar141;
        dVar202 = dVar294 * dVar45;
        dVar223 = dVar45 * dVar98;
        dVar99 = (dVar223 * -1.0676080470633098 +
                 dVar202 * 4.217437034869465 +
                 dVar294 * 1.7059169152930056 + dVar98 * -4.162270540644039) * 3.141592653589793;
        dVar308 = (double)(~-(ulong)(dVar294 < 14.0) & 0x4000000000000000 |
                          -(ulong)(dVar294 < 14.0) & 0x3ff74b6dffbb791d);
        dVar46 = dVar141 * dVar308;
        dVar47 = dVar46 * 2.214317600459161 + dVar200;
        if (dVar47 < 0.0) {
          dVar48 = sqrt(dVar47);
        }
        else {
          dVar48 = SQRT(dVar47);
        }
        dVar49 = xc_erfcx(dVar48);
        dVar142 = dVar141 * dVar45;
        dVar100 = dVar45 * dVar45;
        dVar50 = xc_expint_e1_impl(dVar47,1);
        __x_02 = dVar46 + __x_01;
        if (__x_02 < 0.0) {
          dVar203 = sqrt(__x_02);
        }
        else {
          dVar203 = SQRT(__x_02);
        }
        dVar143 = 1.0 / __x_02;
        dVar183 = dVar46 + dVar138;
        if (dVar183 < 0.0) {
          dVar51 = sqrt(dVar183);
        }
        else {
          dVar51 = SQRT(dVar183);
        }
        dVar52 = dVar100 * -0.20524577845574896 +
                 dVar142 * 2.723636568586566 +
                 dVar45 * -4.841839888141759 + dVar141 * 3.2686565979666846 + -1.0161144;
        dVar53 = log(dVar183 * dVar143);
        dVar101 = 1.0 / (dVar203 * __x_02);
        dVar144 = (1.0 / dVar51) * 2.478878780461809 + dVar101 * -0.5597387610403739;
        dVar145 = 1.0 / dVar183;
        dVar314 = __x_02 * __x_02;
        dVar102 = 1.0 / dVar314;
        dVar146 = dVar145 * -1.0933029406300512 + dVar102 * 0.49374260512735113;
        dVar259 = dVar203 * dVar314;
        dVar147 = dVar138 * 9.0 + dVar46 * 9.0 + -2.0322288;
        dVar295 = dVar51 * dVar183;
        dVar260 = dVar259 * 3.0;
        dVar261 = dVar260 * dVar147 + dVar295 * 4.12995389554944;
        dVar247 = __x_02 * dVar314;
        dVar148 = 1.0 / dVar247;
        dVar103 = dVar138 * 79.7154336165298 + -36.0;
        dVar302 = dVar183 * dVar183;
        dVar236 = 1.0 / dVar302;
        dVar149 = dVar148 * 0.2508588461882105 + dVar103 * 0.007715016088131 * dVar236;
        dVar104 = dVar46 * -6.0966864 + dVar302 * 27.0 + dVar138 * -6.0966864 + 4.12995389554944;
        dVar224 = 1.0 / (dVar203 * dVar247);
        dVar268 = dVar203 * dVar247 * 9.0;
        dVar184 = 1.0 / (dVar51 * dVar302);
        dVar237 = dVar51 * dVar302 * -41.96505624603882 + dVar104 * dVar268;
        dVar314 = dVar314 * dVar314;
        dVar269 = dVar183 * dVar302;
        dVar150 = dVar308 * dVar314 * 81.27826616498021;
        dVar309 = dVar46 * 329.2210656 + dVar302 * -729.0 + dVar138 * 329.2210656 +
                  -297.35668047955966;
        dVar248 = dVar314 * 0.008401793031216;
        dVar249 = dVar248 * dVar309 + dVar150 * dVar183 + dVar269 * 3.384784484376542;
        dVar46 = 1.0 / dVar259;
        dVar310 = dVar46 * dVar261;
        dVar105 = 1.0 / dVar295;
        dVar303 = dVar202 * dVar105;
        dVar225 = dVar224 * dVar237;
        dVar296 = dVar223 * dVar184;
        dVar204 = 1.0 / dVar314;
        dVar205 = dVar204 * dVar249;
        dVar106 = 1.0 / dVar269;
        dVar270 = dVar100 * dVar106;
        dVar315 = (1.0 / dVar203) * -1.0159746228068032;
        if (dVar27 <= 14.0) {
          dVar43 = dVar53 * 0.5080572 +
                   dVar205 * 0.007566670425467926 * dVar270 +
                   dVar225 * 0.0026165591067112575 * dVar296 +
                   dVar149 * dVar142 +
                   dVar310 * -0.09302717396924197 * dVar303 +
                   dVar146 * dVar45 +
                   dVar144 * dVar98 +
                   dVar143 * 0.738073119521991 * dVar141 +
                   dVar315 * dVar294 + (dVar99 * dVar49 * 0.5 - dVar52 * dVar50 * 0.5);
        }
        else {
          dVar43 = dVar44 * 0.5080572 + dVar40 * 0.5080572 + dVar43 * -0.5080572;
        }
        dVar206 = __x_01 * __x_01;
        dVar53 = dVar180 * 6.4753871 * dVar36 + 0.4796583;
        dVar44 = __x_01 * dVar206;
        dVar151 = (dVar53 * dVar96 + 1.0) * -0.463292766;
        dVar152 = (dVar44 * 8.1289152 + dVar206 * -1.48683344 + dVar151 * __x_01 + -0.779335965) *
                  1.7724538509055159;
        if (__x_01 < 0.0) {
          dVar54 = sqrt(__x_01);
        }
        else {
          dVar54 = SQRT(__x_01);
        }
        uVar17 = -(ulong)(dVar136 <= dVar20);
        dVar107 = dVar44 * dVar54;
        dVar287 = 1.0 / dVar107;
        dVar55 = exp(dVar200);
        if (dVar138 < 0.0) {
          dVar185 = sqrt(dVar138);
        }
        else {
          dVar185 = SQRT(dVar138);
        }
        dVar92 = (double)(~uVar17 & (ulong)(dVar22 * dVar136) | uVar17 & (ulong)(dVar20 * dVar21));
        dVar136 = erf(dVar185 * 1.4880583323442536);
        dVar136 = 1.0 - dVar136;
        dVar238 = (dVar55 * dVar136 * -2.3751029502456897 +
                  dVar152 * dVar287 * 0.0625 + 2.356194490192345) * 0.5641895835477563;
        dVar56 = (1.0 / dVar96) * dVar107;
        if (dVar33 <= 0.08) {
          dVar250 = dVar222 * 0.08534541323 + dVar96 * -0.07117647788 + -0.0262841788;
        }
        else {
          dVar250 = dVar238 * -1.0666666666666667 * dVar56;
        }
        dVar279 = dVar96 * dVar250;
        dVar108 = dVar96 * __x_01 * -0.077215461;
        dVar57 = dVar279 + dVar279 +
                 dVar108 * dVar53 +
                 ((dVar206 * -0.37170836 + -0.14853145700326428) - dVar138 * 0.077215461);
        dVar58 = dVar37 * 1.4422495703074083;
        dVar311 = dVar140 * dVar58;
        __x = dVar311 / 3.0 + __x_01;
        dVar186 = dVar96 * __x;
        dVar187 = dVar279 * 15.0 +
                  dVar53 * dVar186 * -0.463292766 +
                  dVar311 * -0.154430922 +
                  dVar138 * -0.463292766 + __x * __x * -1.48683344 + -1.0470559350195856;
        dVar288 = dVar25 * dVar187;
        if (__x < 0.0) {
          dVar59 = sqrt(__x);
        }
        else {
          dVar59 = SQRT(__x);
        }
        dVar226 = (1.0 / dVar59) / (__x * __x);
        dVar59 = p->dens_threshold;
        dVar251 = (dVar37 * p->cam_omega) / 9.869604401089358;
        dVar207 = 1.0 / (dVar89 * dVar201);
        dVar109 = dVar37 * dVar37 * p->cam_omega * 1.4422495703074083;
        dVar208 = dVar97 / 9.869604401089358;
        dVar188 = 1.0 / (dVar201 * dVar201);
        dVar189 = (dVar188 / dVar89) * dVar208 * dVar109;
        dVar209 = (1.0 / __x_01) * dVar226;
        dVar221 = dVar288 * dVar94;
        dVar239 = dVar207 * dVar251 * 0.14814814814814814;
        dVar190 = dVar189 * 0.09876543209876543;
        dVar60 = dVar23 * dVar92 * -0.36927938319101117;
        dVar110 = (double)(uVar10 & (ulong)dVar246 |
                          ~uVar10 & ((ulong)dVar267 & uVar11 | ~uVar11 & (ulong)(dVar179 * -dVar134)
                                    )) + 1.0;
        dVar89 = p->zeta_threshold;
        dVar267 = cbrt(dVar110);
        dVar246 = (double)(uVar12 & (ulong)dVar246 |
                          ~uVar12 & ((~uVar13 & (ulong)dVar135 | uVar13 & (ulong)dVar246) ^
                                    0x8000000000000000)) + 1.0;
        dVar61 = cbrt(dVar246);
        uVar10 = -(ulong)(dVar246 <= dVar89);
        dVar246 = (double)((ulong)dVar21 & uVar10 | ~uVar10 & (ulong)dVar61);
        dVar153 = (1.0 / dVar246) * dVar198 * dVar24;
        dVar62 = (dVar25 * dVar153) / 3.0;
        if (local_4e0 < 0.0) {
          dVar63 = sqrt(local_4e0);
        }
        else {
          dVar63 = SQRT(local_4e0);
        }
        dVar44 = 1.0 / dVar44;
        dVar64 = cbrt(local_e80);
        dVar65 = (1.0 / dVar64) / local_e80;
        dVar111 = (dVar28 * dVar63 * dVar65) / 12.0;
        dVar66 = 15.0;
        if (dVar111 <= 15.0) {
          dVar66 = dVar111;
        }
        dVar67 = dVar66;
        if (dVar66 <= 1.0) {
          dVar67 = 1.0;
        }
        dVar68 = exp(dVar67 + -8.572844);
        dVar69 = log(dVar68 + 1.0);
        uVar12 = -(ulong)(15.0 < dVar111);
        uVar13 = -(ulong)(dVar111 < 1.0);
        dVar69 = (double)(~uVar13 & (uVar12 & 0x4021254bcf0b6b6e |
                                    ~uVar12 & (ulong)(dVar67 - dVar69)) | uVar13 & (ulong)dVar111);
        dVar67 = 1e-15;
        if (1e-15 <= dVar69) {
          dVar67 = dVar69;
        }
        dVar112 = dVar67 * dVar67;
        dVar227 = dVar112 * dVar112;
        dVar191 = dVar112 * 0.00979681 + dVar227 * 0.0410834;
        dVar154 = dVar112 * dVar191;
        dVar192 = dVar112 * dVar227 * 0.0347188 +
                  dVar67 * dVar227 * 0.00120824 + dVar227 * 0.18744 + 1.0;
        dVar70 = 1.0 / dVar192;
        dVar155 = dVar154 * dVar70;
        __x_03 = dVar155 * 2.214317600459161;
        dVar156 = (double)(~-(ulong)(dVar62 < 14.0) & 0x4000000000000000 |
                          -(ulong)(dVar62 < 14.0) & 0x3ff74b6dffbb791d) * dVar37 *
                  1.4422495703074083;
        dVar71 = dVar246 * dVar246;
        dVar113 = 1.0 / dVar71;
        dVar114 = dVar139 * dVar97 * dVar113;
        dVar72 = dVar114 * dVar156 * 0.7381058668197203 + __x_03;
        dVar73 = xc_expint_e1_impl(dVar72,1);
        dVar74 = (dVar114 * dVar156) / 3.0;
        __x_04 = dVar155 + 0.57786348;
        dVar75 = dVar74 + __x_04;
        dVar76 = log(dVar75);
        dVar74 = dVar74 + dVar155;
        dVar77 = log(dVar74);
        dVar193 = 14.0;
        if (dVar62 <= 14.0) {
          dVar193 = dVar62;
        }
        dVar157 = dVar193 * dVar193;
        dVar115 = dVar193 * dVar157;
        dVar78 = dVar157 * dVar157;
        dVar228 = dVar193 * dVar78;
        dVar210 = dVar78 * dVar115;
        dVar116 = (dVar210 * -1.0676080470633098 +
                  dVar228 * 4.217437034869465 +
                  dVar193 * 1.7059169152930056 + dVar115 * -4.162270540644039) * 3.141592653589793;
        dVar6 = (double)(~-(ulong)(dVar193 < 14.0) & 0x4000000000000000 |
                        -(ulong)(dVar193 < 14.0) & 0x3ff74b6dffbb791d);
        dVar79 = dVar157 * dVar6;
        dVar80 = dVar79 * 2.214317600459161 + __x_03;
        if (dVar80 < 0.0) {
          dVar117 = sqrt(dVar80);
        }
        else {
          dVar117 = SQRT(dVar80);
        }
        dVar138 = dVar279 * 5.0 +
                  dVar53 * dVar186 * -0.077215461 +
                  dVar311 * -0.025738487 + (-0.30439865000326427 - dVar138 * 0.077215461);
        dVar311 = dVar139 / __x_06;
        dVar81 = dVar179 * dVar239;
        dVar82 = xc_erfcx(dVar117);
        dVar158 = dVar157 * dVar78;
        dVar118 = dVar78 * dVar78;
        dVar83 = xc_expint_e1_impl(dVar80,1);
        __x_05 = dVar79 + __x_04;
        if (__x_05 < 0.0) {
          dVar211 = sqrt(__x_05);
        }
        else {
          dVar211 = SQRT(__x_05);
        }
        dVar84 = (1.0 / dVar206) * dVar226;
        dVar229 = dVar311 * (dVar279 + -0.051955731);
        dVar159 = 1.0 / __x_05;
        dVar194 = dVar79 + dVar155;
        if (dVar194 < 0.0) {
          dVar85 = sqrt(dVar194);
        }
        else {
          dVar85 = SQRT(dVar194);
        }
        dVar119 = dVar44 * dVar226;
        dVar86 = dVar118 * -0.20524577845574896 +
                 dVar158 * 2.723636568586566 +
                 dVar78 * -4.841839888141759 + dVar157 * 3.2686565979666846 + -1.0161144;
        dVar87 = log(dVar194 * dVar159);
        dVar212 = 1.0 / (dVar211 * __x_05);
        dVar160 = (1.0 / dVar85) * 2.478878780461809 + dVar212 * -0.5597387610403739;
        dVar161 = 1.0 / dVar194;
        dVar304 = __x_05 * __x_05;
        dVar120 = 1.0 / dVar304;
        dVar162 = dVar161 * -1.0933029406300512 + dVar120 * 0.49374260512735113;
        dVar280 = dVar211 * dVar304;
        dVar163 = dVar155 * 9.0 + dVar79 * 9.0 + -2.0322288;
        dVar271 = dVar85 * dVar194;
        dVar281 = dVar280 * 3.0;
        dVar282 = dVar281 * dVar163 + dVar271 * 4.12995389554944;
        dVar316 = __x_05 * dVar304;
        dVar164 = 1.0 / dVar316;
        dVar121 = dVar155 * 79.7154336165298 + -36.0;
        dVar312 = dVar194 * dVar194;
        dVar240 = 1.0 / dVar312;
        dVar165 = dVar164 * 0.2508588461882105 + dVar121 * 0.007715016088131 * dVar240;
        dVar122 = dVar79 * -6.0966864 + dVar312 * 27.0 + dVar155 * -6.0966864 + 4.12995389554944;
        dVar230 = 1.0 / (dVar211 * dVar316);
        dVar289 = dVar211 * dVar316 * 9.0;
        dVar241 = 1.0 / (dVar85 * dVar312);
        dVar262 = dVar85 * dVar312 * -41.96505624603882 + dVar122 * dVar289;
        dVar304 = dVar304 * dVar304;
        dVar213 = dVar194 * dVar312;
        dVar166 = dVar6 * dVar304 * 81.27826616498021;
        dVar252 = dVar79 * 329.2210656 + dVar312 * -729.0 + dVar155 * 329.2210656 +
                  -297.35668047955966;
        dVar317 = dVar304 * 0.008401793031216;
        dVar318 = dVar317 * dVar252 + dVar166 * dVar194 + dVar213 * 3.384784484376542;
        dVar79 = 1.0 / dVar280;
        dVar167 = dVar79 * dVar282;
        dVar123 = 1.0 / dVar271;
        dVar290 = dVar228 * dVar123;
        dVar231 = dVar230 * dVar262;
        dVar253 = dVar210 * dVar241;
        dVar124 = 1.0 / dVar304;
        dVar195 = dVar124 * dVar318;
        dVar125 = 1.0 / dVar213;
        dVar242 = dVar118 * dVar125;
        dVar214 = (1.0 / dVar211) * -1.0159746228068032;
        if (dVar62 <= 14.0) {
          local_ee8 = dVar87 * 0.5080572 +
                      dVar195 * 0.007566670425467926 * dVar242 +
                      dVar231 * 0.0026165591067112575 * dVar253 +
                      dVar165 * dVar158 +
                      dVar167 * -0.09302717396924197 * dVar290 +
                      dVar162 * dVar78 +
                      dVar160 * dVar115 +
                      dVar159 * 0.738073119521991 * dVar157 +
                      dVar214 * dVar193 + (dVar116 * dVar82 * 0.5 - dVar86 * dVar83 * 0.5);
        }
        else {
          local_ee8 = dVar77 * 0.5080572 + dVar73 * 0.5080572 + dVar76 * -0.5080572;
        }
        dVar243 = __x_04 * __x_04;
        dVar87 = dVar191 * 6.4753871 * dVar70 + 0.4796583;
        dVar76 = __x_04 * dVar243;
        dVar168 = (dVar87 * dVar112 + 1.0) * -0.463292766;
        dVar77 = (dVar76 * 8.1289152 + dVar243 * -1.48683344 + dVar168 * __x_04 + -0.779335965) *
                 1.7724538509055159;
        if (__x_04 < 0.0) {
          dVar88 = sqrt(__x_04);
        }
        else {
          dVar88 = SQRT(__x_04);
        }
        dVar215 = dVar229 * dVar190 * dVar119 +
                  dVar138 * dVar81 * dVar84 +
                  dVar43 * -0.8888888888888888 + dVar57 * -0.4444444444444444 * dVar44 +
                  (dVar221 * dVar209) / 27.0;
        uVar18 = -(ulong)(dVar110 <= dVar89);
        dVar43 = dVar76 * dVar88;
        dVar297 = 1.0 / dVar43;
        dVar89 = exp(__x_03);
        if (dVar155 < 0.0) {
          dVar196 = sqrt(dVar155);
        }
        else {
          dVar196 = SQRT(dVar155);
        }
        local_aa8._0_4_ = (uint)-(ulong)(dVar19 <= dVar234);
        local_aa8._4_4_ = (uint)(-(ulong)(dVar19 <= dVar234) >> 0x20);
        local_a38 = SUB84(dVar60 * dVar215,0);
        uStack_a34 = (uint)((ulong)(dVar60 * dVar215) >> 0x20);
        local_aa8 = (double)CONCAT44(~local_aa8._4_4_ & uStack_a34,~(uint)local_aa8 & local_a38);
        dVar197 = (double)(~uVar18 & (ulong)(dVar110 * dVar267) | (ulong)(dVar20 * dVar21) & uVar18)
        ;
        dVar21 = erf(dVar196 * 1.4880583323442536);
        dVar21 = 1.0 - dVar21;
        dVar126 = (dVar89 * dVar21 * -2.3751029502456897 +
                  dVar77 * dVar297 * 0.0625 + 2.356194490192345) * 0.5641895835477563;
        dVar110 = (1.0 / dVar112) * dVar43;
        if (dVar67 <= 0.08) {
          dVar127 = dVar227 * 0.08534541323 + dVar112 * -0.07117647788 + -0.0262841788;
        }
        else {
          dVar127 = dVar126 * -1.0666666666666667 * dVar110;
        }
        dVar272 = dVar112 * dVar127;
        dVar128 = dVar112 * __x_04 * -0.077215461;
        dVar90 = dVar272 + dVar272 +
                 dVar128 * dVar87 +
                 ((dVar243 * -0.37170836 + -0.14853145700326428) - dVar155 * 0.077215461);
        dVar76 = 1.0 / dVar76;
        dVar232 = dVar58 * dVar114;
        __x_00 = dVar232 / 3.0 + __x_04;
        dVar169 = dVar112 * __x_00;
        dVar170 = dVar272 * 15.0 +
                  dVar87 * dVar169 * -0.463292766 +
                  dVar232 * -0.154430922 +
                  dVar155 * -0.463292766 + __x_00 * __x_00 * -1.48683344 + -1.0470559350195856;
        dVar129 = dVar25 * dVar170;
        if (__x_00 < 0.0) {
          dVar91 = sqrt(__x_00);
        }
        else {
          dVar91 = SQRT(__x_00);
        }
        dVar291 = (1.0 / dVar91) / (__x_00 * __x_00);
        dVar171 = 1.0 / (dVar246 * dVar71);
        dVar216 = dVar272 * 5.0 +
                  dVar87 * dVar169 * -0.077215461 +
                  dVar232 * -0.025738487 + (-0.30439865000326427 - dVar155 * 0.077215461);
        dVar263 = (1.0 / dVar243) * dVar291;
        dVar172 = 1.0 / (dVar71 * dVar71);
        dVar173 = (dVar172 / dVar246) * dVar208 * dVar109;
        dVar246 = dVar311 * (dVar272 + -0.051955731);
        dVar283 = dVar76 * dVar291;
        dVar155 = dVar291 * (1.0 / __x_04);
        dVar91 = dVar129 * dVar153;
        dVar305 = dVar251 * dVar171 * 0.14814814814814814;
        dVar232 = dVar179 * dVar305;
        dVar174 = dVar173 * 0.09876543209876543;
        dVar175 = dVar174 * dVar246 * dVar283 +
                  dVar232 * dVar216 * dVar263 +
                  (dVar91 * dVar155) / 27.0 +
                  local_ee8 * -0.8888888888888888 + dVar90 * -0.4444444444444444 * dVar76;
        dVar254 = dVar23 * dVar197 * -0.36927938319101117;
        local_aa8 = local_aa8 +
                    (double)(~-(ulong)(local_e80 <= dVar59) & (ulong)(dVar254 * dVar175));
        pdVar1 = out->zk;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar7 = (long)(p->dim).zk * sVar9;
          pdVar1[lVar7] = pdVar1[lVar7] + local_aa8;
        }
        dVar130 = 1.0 / (__x_06 * __x_06);
        dVar284 = dVar179 - dVar134 * dVar130;
        bVar2 = dVar20 < dVar199;
        bVar3 = dVar20 < dVar235;
        dVar235 = 0.0;
        if (bVar3 && bVar2) {
          dVar235 = dVar284;
        }
        dVar273 = (dVar28 * dVar29 * ((1.0 / dVar30) / (dVar19 * dVar19))) / -9.0;
        dVar217 = 1.0 / (dVar34 + 1.0);
        dVar30 = 0.0;
        if (dVar95 <= 15.0) {
          dVar30 = (double)(~uVar15 & (ulong)dVar273 & -(ulong)(1.0 < dVar32));
          dVar30 = dVar30 - dVar34 * dVar30 * dVar217;
        }
        bVar4 = dVar20 < 1.0 - dVar135;
        bVar5 = dVar20 < dVar135 + 1.0;
        dVar135 = 0.0;
        if (bVar5 && bVar4) {
          dVar135 = dVar284;
        }
        dVar176 = dVar92 * dVar139 * 0.9847450218426964 * dVar215 * 0.125;
        dVar298 = (double)(~-(ulong)(dVar35 < 1e-15) &
                          ((ulong)dVar273 & uVar16 | ~uVar16 & (ulong)dVar30));
        dVar319 = dVar298 * dVar36 * dVar33 * dVar180;
        dVar255 = dVar33 * dVar96;
        dVar274 = dVar298 * dVar255;
        dVar30 = dVar33 * dVar298 * 0.01959362 + dVar274 * 0.1643336;
        dVar306 = dVar96 * dVar30 * dVar36;
        dVar256 = 1.0 / (dVar181 * dVar181);
        dVar181 = dVar33 * dVar222 * 0.2083128;
        dVar92 = dVar181 * dVar298 + dVar274 * 0.74976 + dVar298 * dVar222 * 0.0060412;
        dVar299 = dVar92 * dVar256 * dVar137;
        dVar26 = 1.0 / (dVar26 * dVar26);
        dVar218 = (double)(~uVar14 & (ulong)((dVar135 * dVar26) / 3.0));
        dVar264 = dVar37 * 0.0 * 1.4422495703074083;
        dVar140 = dVar140 * dVar264;
        dVar135 = dVar140 * 0.7381058668197203;
        dVar285 = dVar139 * dVar97 * dVar207 * dVar218 * dVar182;
        dVar131 = dVar97 * dVar38 * dVar311;
        dVar37 = dVar131 * dVar182;
        dVar132 = dVar37 * 0.4920705778798135;
        dVar37 = dVar37 * 0.2222222222222222;
        local_d60 = 0.0;
        dVar257 = dVar141 * 0.0;
        dVar273 = dVar24 * dVar198;
        dVar219 = dVar25 / __x_06;
        dVar220 = (dVar219 * dVar94) / 9.0;
        if (dVar27 <= 14.0) {
          local_d60 = (dVar25 * dVar38 * dVar273 * dVar218) / -3.0 - dVar220;
        }
        dVar93 = (dVar306 * 2.214317600459161 + dVar319 * 4.428635200918322) -
                 dVar299 * 2.214317600459161;
        dVar140 = dVar140 / 3.0;
        dVar320 = (dVar319 + dVar319 + dVar306) - dVar299;
        dVar40 = dVar40 - 1.0 / dVar39;
        dVar42 = 1.0 / dVar42;
        dVar41 = 1.0 / dVar41;
        dVar295 = dVar295 * -104.91264061509705;
        dVar259 = dVar259 * dVar104 * 31.5;
        dVar52 = dVar52 * (dVar50 - 1.0 / dVar47);
        dVar100 = dVar100 * (1.0 / (dVar302 * dVar302));
        dVar321 = dVar146 * dVar98 * 4.0;
        dVar104 = dVar141 * dVar102 * -0.738073119521991;
        dVar292 = dVar294 * dVar143 * 1.476146239043982;
        dVar144 = dVar144 * dVar141 * 3.0;
        dVar286 = dVar149 * dVar202 * 6.0;
        dVar146 = (1.0 / (__x_02 * dVar314)) * dVar249 * -0.030266681701871703;
        dVar149 = dVar101 * dVar294 * 0.5079873114034016;
        dVar249 = dVar205 * -0.022700011276403777;
        dVar39 = ((1.0 / dVar203) / dVar314) * dVar237 * -0.0091579568734894;
        dVar269 = ((1.0 / dVar51) / dVar269) * dVar223;
        dVar47 = dVar184 * dVar202;
        dVar102 = dVar102 * dVar183;
        dVar314 = dVar314 * 0.0 * 81.27826616498021 * dVar183;
        dVar313 = dVar308 * dVar247 * 325.11306465992084;
        dVar302 = dVar302 * 10.154353453129625;
        dVar101 = dVar309 * dVar247 * 0.033607172124864;
        dVar247 = dVar147 * dVar203 * __x_02 * 7.5;
        dVar309 = ((dVar48 + dVar48) * dVar49 + -1.1283791670955126) * (1.0 / dVar48);
        dVar48 = dVar46 * 0.8396081415605609;
        dVar147 = dVar236 * 1.0933029406300512;
        dVar203 = dVar103 * dVar106 * -0.015430032176262;
        dVar237 = dVar261 * dVar224 * 0.23256793492310493;
        dVar103 = dVar310 * 0.13954076095386297;
        if (dVar27 <= 14.0) {
          dVar285 = dVar294 * dVar308 * local_d60;
          dVar261 = dVar285 + dVar285 + dVar257 + dVar320;
          dVar322 = dVar183 * dVar261;
          dVar233 = dVar285 * 4.428635200918322 + dVar257 * 2.214317600459161 + dVar93;
          local_a78 = dVar296 * dVar261 * dVar39 +
                      dVar223 * dVar106 * local_d60 * dVar205 * 0.060533363403743407 +
                      dVar249 * dVar100 * dVar261 +
                      dVar270 * dVar261 * dVar146 +
                      dVar49 * (dVar142 * local_d60 * -7.473256329443169 +
                               dVar45 * local_d60 * 21.087185174347326 +
                               local_d60 * 1.7059169152930056 +
                               dVar141 * local_d60 * -12.48681162193212) * 3.141592653589793 * 0.5 +
                      dVar144 * local_d60 +
                      dVar292 * local_d60 +
                      dVar261 * dVar104 +
                      dVar149 * dVar261 +
                      ((((dVar285 * -12.1933728 +
                         ((dVar299 * 6.0966864 +
                          dVar306 * -6.0966864 + dVar322 * 54.0 + dVar319 * -12.1933728) -
                         dVar257 * 6.0966864)) * dVar268 + dVar295 * dVar261 + dVar259 * dVar261) *
                        dVar224 * 0.0026165591067112575 * dVar296 + dVar321 * local_d60) -
                      dVar233 * dVar52 * 0.5) + dVar286 * local_d60 +
                      dVar142 * (dVar203 * dVar261 +
                                dVar204 * dVar261 * -0.7525765385646315 +
                                (dVar299 * -79.7154336165298 +
                                dVar319 * 159.4308672330596 + dVar306 * 79.7154336165298) *
                                0.007715016088131 * dVar236) +
                      dVar45 * (dVar147 * dVar261 + dVar148 * -0.9874852102547023 * dVar261) +
                      ((dVar315 * local_d60 +
                       (dVar105 * -1.2394393902309044 * dVar261 + dVar48 * dVar261) * dVar98 +
                       dVar309 * dVar233 * dVar99 * 0.25 +
                       (dVar51 * dVar261 * 6.19493084332416 +
                       dVar247 * dVar261 +
                       (dVar285 * 18.0 +
                       dVar299 * -9.0 + dVar319 * 18.0 + dVar306 * 9.0 + dVar257 * 9.0) * dVar260) *
                       dVar46 * -0.09302717396924197 * dVar303 +
                       ((dVar285 * 658.4421312 +
                        dVar299 * -329.2210656 +
                        dVar306 * 329.2210656 + dVar322 * -1458.0 + dVar319 * 658.4421312 +
                        dVar257 * 329.2210656) * dVar248 +
                       dVar101 * dVar261 +
                       dVar302 * dVar261 + dVar150 * dVar261 + dVar313 * dVar322 + dVar314) *
                       dVar204 * 0.007566670425467926 * dVar270 +
                       (dVar261 * dVar143 - dVar261 * dVar102) * dVar145 * 0.5080572 * __x_02 +
                       dVar47 * dVar261 * dVar103 +
                       dVar303 * dVar261 * dVar237 +
                       dVar45 * dVar105 * local_d60 * dVar310 * -0.46513586984620986 +
                       dVar142 * dVar184 * local_d60 * dVar225 * 0.0183159137469788 +
                       dVar269 * dVar261 * dVar225 * -0.006541397766778144) -
                      (dVar223 * -1.6419662276459916 * local_d60 +
                      dVar202 * local_d60 * 16.341819411519396 +
                      dVar294 * local_d60 * 6.537313195933369 +
                      dVar98 * local_d60 * -19.367359552567034) * dVar50 * 0.5);
        }
        else {
          dVar261 = ((dVar285 * -0.6666666666666666 + dVar140 + dVar320) - dVar37) * 0.5080572;
          local_a78 = dVar261 * dVar41 +
                      (((dVar285 * -1.4762117336394407 + dVar135 + dVar93) - dVar132) * dVar40 *
                       0.5080572 - dVar42 * dVar261);
        }
        dVar200 = exp(-dVar200);
        dVar261 = dVar180 * dVar256 * -6.4753871;
        dVar322 = dVar30 * 6.4753871 * dVar36 + dVar92 * dVar261;
        dVar107 = (1.0 / dVar255) * dVar107;
        dVar285 = (1.0 / dVar96) * dVar206 * dVar54;
        dVar92 = dVar33 * dVar53 + dVar33 * dVar53;
        dVar54 = (1.0 / dVar54) / (dVar206 * dVar206);
        dVar152 = dVar152 * -0.21875;
        dVar30 = dVar200 * dVar55 * 1.9940105822687055;
        if (dVar33 <= 0.08) {
          local_f08 = dVar33 * dVar298 * -0.14235295576 + dVar274 * 0.34138165292;
        }
        else {
          local_f08 = dVar238 * -3.7333333333333334 * dVar320 * dVar285 +
                      (dVar320 * (1.0 / dVar185) * dVar30 +
                      dVar93 * dVar55 * dVar136 * -2.3751029502456897 +
                      dVar320 * dVar54 * dVar152 +
                      (dVar206 * 24.3867456 * dVar320 +
                      __x_01 * dVar320 * -2.97366688 +
                      (dVar92 * dVar298 + dVar96 * dVar322) * -0.463292766 * __x_01 +
                      dVar151 * dVar320) * 1.7724538509055159 * dVar287 * 0.0625) *
                      0.5641895835477563 * -1.0666666666666667 * dVar56 +
                      dVar238 * 2.1333333333333333 * dVar298 * dVar107;
        }
        dVar275 = dVar33 * __x_01 * -0.154430922;
        dVar200 = 1.0 / (dVar206 * dVar206);
        dVar274 = (dVar187 * dVar219 * dVar94 * dVar209) / 81.0;
        dVar293 = dVar139 * dVar207 * dVar97 * dVar58;
        dVar131 = dVar131 * dVar58;
        dVar307 = dVar226 / __x;
        dVar244 = __x * -2.97366688;
        dVar187 = (1.0 / __x_01) * dVar307;
        dVar93 = (1.0 / dVar206) * dVar138;
        dVar233 = dVar239 * dVar130 * dVar138 * dVar84;
        dVar239 = dVar207 * dVar179 * dVar251;
        dVar265 = dVar139 / (__x_06 * __x_06);
        dVar266 = dVar189 * 0.1646090534979424 * (dVar279 + -0.051955731) * dVar265 * dVar119;
        dVar300 = dVar200 * dVar226;
        dVar279 = dVar44 * dVar307;
        dVar200 = dVar57 * dVar200 * 1.3333333333333333;
        dVar276 = dVar38 * dVar198 * dVar24 * dVar288;
        dVar288 = dVar94 * -0.09259259259259259 * dVar288;
        dVar323 = dVar179 * dVar188 * dVar251 * -0.4444444444444444;
        dVar57 = dVar239 * -0.2962962962962963;
        dVar239 = dVar239 * -0.37037037037037035;
        dVar188 = (dVar188 / dVar201) * dVar208 * dVar109 * -0.49382716049382713 * dVar229;
        dVar201 = dVar189 * -0.2962962962962963 * dVar229;
        dVar229 = dVar189 * -0.24691358024691357 * dVar229;
        local_128 = 0.0;
        local_9e0 = 0.0;
        if (dVar234 < dVar19) {
          dVar189 = dVar218 * dVar293;
          dVar277 = (dVar189 * -0.6666666666666666 + dVar320) - dVar131 * 0.2222222222222222;
          dVar301 = dVar96 * dVar277 * dVar53;
          dVar258 = dVar298 * dVar53 * dVar33 * __x;
          dVar245 = dVar298 * dVar250 * dVar33;
          local_f08 = local_f08 * dVar96;
          local_9e0 = (dVar277 * dVar279 * dVar229 +
                      dVar320 * dVar300 * dVar201 +
                      (dVar245 + dVar245 + local_f08) * dVar311 * dVar190 * dVar119 +
                      ((dVar218 * dVar119 * dVar188 +
                       dVar277 * dVar307 * dVar93 * dVar239 +
                       dVar320 * dVar226 * dVar138 * dVar44 * dVar57 +
                       (local_f08 * 5.0 +
                       dVar245 * 10.0 +
                       dVar186 * dVar322 * -0.077215461 +
                       dVar258 * -0.154430922 +
                       dVar301 * -0.077215461 +
                       dVar189 * 0.051476974 +
                       (dVar319 * -0.154430922 - dVar306 * 0.077215461) + dVar299 * 0.077215461 +
                       dVar131 * 0.017158991333333335) * dVar81 * dVar84 +
                       ((dVar218 * dVar226 * dVar93 * dVar323 +
                        dVar277 * dVar187 * dVar288 +
                        ((((local_f08 * 15.0 +
                           dVar245 * 30.0 +
                           dVar186 * dVar322 * -0.463292766 +
                           dVar258 * -0.926585532 +
                           dVar301 * -0.463292766 +
                           dVar189 * 0.308861844 +
                           dVar299 * 0.463292766 +
                           dVar306 * -0.463292766 + dVar277 * dVar244 + dVar319 * -0.926585532 +
                           dVar131 * 0.102953948) * dVar25 * dVar94 * dVar209) / 27.0 +
                         (((dVar200 * dVar320 +
                           local_a78 * -0.8888888888888888 +
                           (local_f08 + local_f08 +
                           dVar245 * 4.0 +
                           dVar322 * dVar108 +
                           dVar298 * dVar53 * dVar275 +
                           dVar96 * dVar320 * -0.077215461 * dVar53 +
                           ((__x_01 * dVar320 * -0.74341672 + dVar319 * -0.154430922) -
                           dVar306 * 0.077215461) + dVar299 * 0.077215461) * -0.4444444444444444 *
                           dVar44) - (dVar218 * dVar209 * dVar276) / 27.0) - dVar274)) -
                        (dVar320 * dVar84 * dVar221) / 27.0)) - dVar233)) - dVar266)) * dVar60 +
                      ((double)(~uVar17 & (ulong)(dVar235 * dVar22 * 1.3333333333333333)) * dVar23 *
                       -0.36927938319101117 * dVar215 - dVar176);
        }
        dVar235 = -dVar134 * dVar130;
        if (dVar20 < dVar199) {
          local_128 = (double)(~uVar11 & (ulong)(-dVar179 - dVar235));
        }
        dVar199 = 0.0;
        dVar20 = 0.0;
        if (bVar5 && bVar4) {
          dVar20 = -dVar284;
        }
        dVar189 = dVar197 * dVar139 * 0.9847450218426964 * dVar175 * 0.125;
        dVar264 = dVar264 * dVar114;
        dVar114 = dVar264 * 0.7381058668197203;
        dVar298 = 1.0 / (dVar61 * dVar61);
        dVar299 = (double)(~uVar10 & (ulong)((dVar20 * dVar298) / 3.0));
        dVar61 = dVar139 * dVar97 * dVar171 * dVar299 * dVar156;
        dVar197 = dVar97 * dVar113 * dVar311;
        dVar284 = dVar197 * dVar156;
        dVar20 = dVar284 * 0.4920705778798135;
        dVar284 = dVar284 * 0.2222222222222222;
        dVar306 = dVar157 * 0.0;
        dVar218 = (dVar219 * dVar153) / 9.0;
        if (dVar62 <= 14.0) {
          dVar199 = (dVar25 * dVar113 * dVar273 * dVar299) / -3.0 - dVar218;
        }
        dVar264 = dVar264 / 3.0;
        dVar73 = dVar73 - 1.0 / dVar72;
        dVar75 = 1.0 / dVar75;
        dVar74 = 1.0 / dVar74;
        dVar319 = dVar163 * dVar211 * __x_05 * 7.5;
        dVar271 = dVar271 * -104.91264061509705;
        dVar122 = dVar280 * dVar122 * 31.5;
        dVar72 = -dVar194 * dVar120;
        dVar86 = dVar86 * (dVar83 - 1.0 / dVar80);
        dVar117 = ((dVar117 + dVar117) * dVar82 + -1.1283791670955126) * (1.0 / dVar117);
        dVar322 = dVar165 * dVar228 * 6.0;
        dVar301 = dVar212 * dVar193 * 0.5079873114034016;
        dVar212 = dVar120 * dVar157 * -0.738073119521991;
        dVar320 = dVar193 * dVar159 * 1.476146239043982;
        dVar280 = dVar160 * dVar157 * 3.0;
        dVar160 = dVar162 * dVar115 * 4.0;
        dVar80 = dVar282 * dVar230 * 0.23256793492310493;
        dVar245 = dVar228 * dVar241;
        dVar258 = ((1.0 / dVar85) / dVar213) * dVar210;
        dVar118 = dVar118 * (1.0 / (dVar312 * dVar312));
        dVar120 = dVar121 * dVar125 * 0.015430032176262;
        dVar165 = dVar79 * 0.8396081415605609;
        dVar277 = dVar240 * 1.0933029406300512;
        dVar282 = dVar304 * 0.0 * 81.27826616498021 * dVar194;
        dVar163 = dVar6 * dVar316 * 325.11306465992084;
        dVar312 = dVar312 * 10.154353453129625;
        dVar121 = dVar252 * dVar316 * 0.033607172124864;
        dVar213 = dVar167 * 0.13954076095386297;
        dVar211 = ((1.0 / dVar211) / dVar304) * dVar262 * -0.0091579568734894;
        dVar252 = dVar231 * -0.006541397766778144;
        dVar262 = (1.0 / (__x_05 * dVar304)) * dVar318 * -0.030266681701871703;
        dVar162 = dVar195 * -0.022700011276403777;
        if (dVar62 <= 14.0) {
          dVar316 = dVar193 * dVar6 * dVar199;
          dVar61 = dVar316 + dVar316 + dVar306;
          dVar304 = dVar194 * dVar61;
          dVar318 = dVar316 * 4.428635200918322 + dVar306 * 2.214317600459161;
          dVar199 = dVar80 * dVar61 * dVar290 +
                    dVar318 * dVar117 * dVar116 * 0.25 +
                    dVar199 * dVar160 +
                    dVar280 * dVar199 +
                    dVar320 * dVar199 +
                    dVar212 * dVar61 +
                    dVar301 * dVar61 +
                    (((dVar72 * dVar61 + dVar159 * dVar61) * dVar161 * 0.5080572 * __x_05 +
                      dVar322 * dVar199 +
                      (dVar85 * dVar61 * 6.19493084332416 +
                      dVar319 * dVar61 + (dVar316 * 18.0 + dVar306 * 9.0) * dVar281) * dVar79 *
                      -0.09302717396924197 * dVar290 +
                      ((dVar316 * -12.1933728 + (dVar304 * 54.0 - dVar306 * 6.0966864)) * dVar289 +
                      dVar271 * dVar61 + dVar122 * dVar61) * dVar230 * 0.0026165591067112575 *
                      dVar253 +
                     (dVar158 * dVar199 * -7.473256329443169 +
                     dVar78 * dVar199 * 21.087185174347326 +
                     dVar199 * 1.7059169152930056 + dVar157 * dVar199 * -12.48681162193212) *
                     3.141592653589793 * dVar82 * 0.5) - dVar318 * dVar86 * 0.5) +
                    dVar242 * ((dVar316 * 658.4421312 + dVar304 * -1458.0 + dVar306 * 329.2210656) *
                               dVar317 +
                              dVar121 * dVar61 +
                              dVar312 * dVar61 + dVar166 * dVar61 + dVar163 * dVar304 + dVar282) *
                              dVar124 * 0.007566670425467926 +
                    (dVar277 * dVar61 + dVar164 * -0.9874852102547023 * dVar61) * dVar78 +
                    (dVar123 * -1.2394393902309044 * dVar61 + dVar165 * dVar61) * dVar115 +
                    dVar214 * dVar199 +
                    (((dVar124 * dVar61 * -0.7525765385646315 - dVar61 * dVar120) * dVar158 +
                     dVar210 * dVar125 * dVar199 * dVar195 * 0.060533363403743407 +
                     dVar118 * dVar61 * dVar162 +
                     dVar242 * dVar61 * dVar262 +
                     dVar241 * dVar158 * dVar199 * dVar231 * 0.0183159137469788 +
                     dVar258 * dVar61 * dVar252 +
                     dVar253 * dVar61 * dVar211 +
                     (dVar245 * dVar61 * dVar213 -
                     dVar78 * dVar123 * dVar199 * dVar167 * 0.46513586984620986)) -
                    dVar83 * (dVar210 * -1.6419662276459916 * dVar199 +
                             dVar228 * dVar199 * 16.341819411519396 +
                             dVar193 * dVar199 * 6.537313195933369 +
                             dVar115 * dVar199 * -19.367359552567034) * 0.5);
        }
        else {
          dVar199 = ((dVar61 * -0.6666666666666666 + dVar264) - dVar284) * 0.5080572;
          dVar199 = dVar199 * dVar74 +
                    (((dVar61 * -1.4762117336394407 + dVar114) - dVar20) * dVar73 * 0.5080572 -
                    dVar75 * dVar199);
        }
        dVar61 = (dVar219 * dVar170 * dVar153 * dVar155) / 81.0;
        dVar318 = dVar97 * dVar58 * dVar139 * dVar171;
        dVar58 = dVar58 * dVar197;
        dVar197 = __x_00 * -2.97366688;
        dVar316 = dVar171 * dVar179 * dVar251;
        dVar219 = dVar291 / __x_00;
        dVar278 = (1.0 / __x_04) * dVar219;
        dVar304 = (1.0 / dVar243) * dVar216;
        dVar305 = dVar130 * dVar305 * dVar216 * dVar263;
        dVar265 = dVar173 * 0.1646090534979424 * dVar265 * (dVar272 + -0.051955731) * dVar283;
        dVar170 = dVar76 * dVar219;
        dVar198 = dVar24 * dVar113 * dVar198 * dVar129;
        dVar129 = dVar153 * -0.09259259259259259 * dVar129;
        dVar272 = dVar179 * dVar172 * dVar251 * -0.4444444444444444;
        dVar251 = dVar316 * -0.37037037037037035;
        dVar208 = dVar109 * dVar208 * (dVar172 / dVar71) * -0.49382716049382713 * dVar246;
        dVar24 = dVar173 * -0.24691358024691357 * dVar246;
        dVar109 = 0.0;
        if (dVar59 < local_e80) {
          dVar71 = dVar299 * dVar318;
          dVar109 = dVar71 * -0.6666666666666666 - dVar58 * 0.2222222222222222;
          dVar172 = dVar109 * dVar112 * dVar87;
          dVar109 = (dVar109 * dVar170 * dVar24 +
                    ((dVar299 * dVar283 * dVar208 +
                     dVar109 * dVar219 * dVar304 * dVar251 +
                     (dVar172 * -0.077215461 + dVar71 * 0.051476974 + dVar58 * 0.017158991333333335)
                     * dVar232 * dVar263 +
                     ((dVar299 * dVar291 * dVar304 * dVar272 +
                      dVar109 * dVar278 * dVar129 +
                      ((dVar172 * -0.463292766 +
                       dVar197 * dVar109 + dVar71 * 0.308861844 + dVar58 * 0.102953948) * dVar25 *
                       dVar153 * dVar155) / 27.0 +
                      ((dVar199 * -0.8888888888888888 + (dVar299 * dVar155 * dVar198) / -27.0) -
                      dVar61)) - dVar305)) - dVar265)) * dVar254 +
                    ((double)(~uVar18 & (ulong)(local_128 * dVar267 * 1.3333333333333333)) * dVar23
                     * -0.36927938319101117 * dVar175 - dVar189);
        }
        pdVar1 = out->vrho;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar7 = (long)(p->dim).vrho * sVar9;
          pdVar1[lVar7] = (local_9e0 + dVar109) * __x_06 + local_aa8 + pdVar1[lVar7];
        }
        dVar109 = -dVar179 - dVar134 * dVar130;
        dVar199 = 0.0;
        dVar134 = 0.0;
        if (bVar3 && bVar2) {
          dVar134 = dVar109;
        }
        dVar71 = 0.0;
        if (bVar5 && bVar4) {
          dVar71 = dVar109;
        }
        dVar26 = (double)(~uVar14 & (ulong)((dVar71 * dVar26) / 3.0));
        dVar182 = dVar26 * dVar139 * dVar97 * dVar207 * dVar182;
        if (dVar27 <= 14.0) {
          dVar199 = (dVar25 * dVar38 * dVar273 * dVar26) / -3.0 - dVar220;
        }
        if (dVar27 <= 14.0) {
          dVar182 = dVar294 * dVar308 * dVar199;
          dVar37 = dVar182 + dVar182 + dVar257;
          dVar135 = dVar182 * 4.428635200918322 + dVar257 * 2.214317600459161;
          dVar38 = dVar183 * dVar37;
          dVar135 = dVar223 * dVar106 * dVar199 * dVar205 * 0.060533363403743407 +
                    dVar100 * dVar37 * dVar249 +
                    dVar270 * dVar37 * dVar146 +
                    dVar225 * 0.0183159137469788 * dVar142 * dVar184 * dVar199 +
                    dVar269 * dVar37 * dVar225 * -0.006541397766778144 +
                    dVar296 * dVar37 * dVar39 +
                    dVar310 * -0.46513586984620986 * dVar45 * dVar105 * dVar199 +
                    dVar47 * dVar37 * dVar103 +
                    dVar303 * dVar37 * dVar237 +
                    dVar309 * dVar135 * dVar99 * 0.25 +
                    (dVar105 * dVar37 * -1.2394393902309044 + dVar48 * dVar37) * dVar98 +
                    dVar315 * dVar199 +
                    ((dVar204 * dVar37 * -0.7525765385646315 + dVar203 * dVar37) * dVar142 -
                    dVar50 * (dVar223 * dVar199 * -1.6419662276459916 +
                             dVar202 * dVar199 * 16.341819411519396 +
                             dVar294 * dVar199 * 6.537313195933369 +
                             dVar98 * dVar199 * -19.367359552567034) * 0.5) +
                    dVar45 * (dVar147 * dVar37 + dVar148 * dVar37 * -0.9874852102547023) +
                    dVar37 * dVar149 +
                    (((dVar37 * dVar143 - dVar37 * dVar102) * dVar145 * 0.5080572 * __x_02 +
                      dVar286 * dVar199 +
                      ((dVar182 * 658.4421312 + dVar38 * -1458.0 + dVar257 * 329.2210656) * dVar248
                      + dVar101 * dVar37 +
                        dVar302 * dVar37 + dVar150 * dVar37 + dVar313 * dVar38 + dVar314) * dVar204
                      * 0.007566670425467926 * dVar270 +
                      ((dVar182 * -12.1933728 + (dVar38 * 54.0 - dVar257 * 6.0966864)) * dVar268 +
                      dVar295 * dVar37 + dVar259 * dVar37) * dVar224 * 0.0026165591067112575 *
                      dVar296 + (dVar51 * dVar37 * 6.19493084332416 +
                                dVar247 * dVar37 + (dVar182 * 18.0 + dVar257 * 9.0) * dVar260) *
                                dVar46 * -0.09302717396924197 * dVar303 +
                                dVar321 * dVar199 +
                                dVar144 * dVar199 + dVar104 * dVar37 + dVar292 * dVar199 +
                     (dVar142 * dVar199 * -7.473256329443169 +
                     dVar45 * dVar199 * 21.087185174347326 +
                     dVar199 * 1.7059169152930056 + dVar141 * dVar199 * -12.48681162193212) *
                     3.141592653589793 * dVar49 * 0.5) - dVar135 * dVar52 * 0.5);
        }
        else {
          dVar199 = ((dVar182 * -0.6666666666666666 + dVar140) - dVar37) * 0.5080572;
          dVar135 = dVar199 * dVar41 +
                    (((dVar182 * -1.4762117336394407 + dVar135) - dVar132) * dVar40 * 0.5080572 -
                    dVar42 * dVar199);
        }
        dVar199 = 0.0;
        dVar294 = 0.0;
        if (dVar234 < dVar19) {
          dVar293 = dVar293 * dVar26;
          dVar294 = dVar293 * -0.6666666666666666 - dVar131 * 0.2222222222222222;
          dVar37 = dVar294 * dVar96 * dVar53;
          dVar294 = (dVar294 * dVar279 * dVar229 +
                    ((dVar188 * dVar26 * dVar119 +
                     dVar294 * dVar307 * dVar93 * dVar239 +
                     (dVar37 * -0.077215461 + dVar293 * 0.051476974 + dVar131 * 0.017158991333333335
                     ) * dVar81 * dVar84 +
                     ((dVar323 * dVar26 * dVar226 * dVar93 +
                      dVar294 * dVar187 * dVar288 +
                      ((dVar37 * -0.463292766 +
                       dVar131 * 0.102953948 + dVar244 * dVar294 + dVar293 * 0.308861844) * dVar25 *
                       dVar94 * dVar209) / 27.0 +
                      ((dVar135 * -0.8888888888888888 + (dVar276 * dVar26 * dVar209) / -27.0) -
                      dVar274)) - dVar233)) - dVar266)) * dVar60 +
                    ((double)(~uVar17 & (ulong)(dVar22 * 1.3333333333333333 * dVar134)) * dVar23 *
                     -0.36927938319101117 * dVar215 - dVar176);
        }
        dVar22 = 0.0;
        if (bVar3 && bVar2) {
          dVar22 = dVar179 - dVar235;
        }
        dVar135 = (dVar28 * dVar63 * ((1.0 / dVar64) / (local_e80 * local_e80))) / -9.0;
        dVar134 = 1.0 / (dVar68 + 1.0);
        dVar26 = 0.0;
        if (dVar111 <= 15.0) {
          dVar26 = (double)(~uVar12 & (ulong)dVar135 & -(ulong)(1.0 < dVar66));
          dVar26 = dVar26 - dVar68 * dVar26 * dVar134;
        }
        dVar179 = 0.0;
        if (bVar5 && bVar4) {
          dVar179 = -dVar109;
        }
        dVar235 = (double)(~-(ulong)(dVar69 < 1e-15) &
                          ((ulong)dVar135 & uVar13 | ~uVar13 & (ulong)dVar26));
        dVar38 = dVar235 * dVar70 * dVar67 * dVar191;
        dVar26 = dVar67 * dVar112;
        dVar37 = dVar235 * dVar26;
        dVar135 = (double)(~uVar10 & (ulong)((dVar179 * dVar298) / 3.0));
        dVar179 = dVar67 * dVar227 * 0.2083128;
        dVar156 = dVar97 * dVar171 * dVar139 * dVar135 * dVar156;
        if (dVar62 <= 14.0) {
          dVar199 = (dVar25 * dVar113 * dVar273 * dVar135) / -3.0 - dVar218;
        }
        dVar97 = dVar67 * dVar235 * 0.01959362 + dVar37 * 0.1643336;
        dVar202 = dVar112 * dVar97 * dVar70;
        dVar139 = 1.0 / (dVar192 * dVar192);
        dVar308 = dVar179 * dVar235 + dVar37 * 0.74976 + dVar235 * dVar227 * 0.0060412;
        dVar141 = dVar308 * dVar139 * dVar154;
        dVar140 = (dVar202 * 2.214317600459161 + dVar38 * 4.428635200918322) -
                  dVar141 * 2.214317600459161;
        dVar182 = (dVar38 + dVar38 + dVar202) - dVar141;
        dVar120 = -dVar120;
        if (dVar62 <= 14.0) {
          dVar50 = dVar193 * dVar6 * dVar199;
          dVar20 = dVar50 + dVar50 + dVar306 + dVar182;
          dVar49 = dVar194 * dVar20;
          dVar223 = dVar50 * 4.428635200918322 + dVar306 * 2.214317600459161 + dVar140;
          local_ef8 = dVar290 * (dVar85 * dVar20 * 6.19493084332416 +
                                dVar319 * dVar20 +
                                (dVar50 * 18.0 +
                                dVar306 * 9.0 + dVar141 * -9.0 + dVar38 * 18.0 + dVar202 * 9.0) *
                                dVar281) * dVar79 * -0.09302717396924197 +
                      dVar158 * (dVar120 * dVar20 +
                                dVar124 * dVar20 * -0.7525765385646315 +
                                (dVar141 * -79.7154336165298 +
                                dVar38 * 159.4308672330596 + dVar202 * 79.7154336165298) *
                                0.007715016088131 * dVar240) +
                      dVar78 * (dVar277 * dVar20 + dVar164 * dVar20 * -0.9874852102547023) +
                      dVar214 * dVar199 +
                      (dVar123 * dVar20 * -1.2394393902309044 + dVar165 * dVar20) * dVar115 +
                      ((((dVar245 * dVar20 * dVar213 +
                         dVar290 * dVar20 * dVar80 +
                         dVar253 * dVar20 * dVar211 +
                         ((dVar50 * 658.4421312 +
                          dVar306 * 329.2210656 +
                          dVar141 * -329.2210656 +
                          dVar202 * 329.2210656 + dVar49 * -1458.0 + dVar38 * 658.4421312) * dVar317
                         + dVar121 * dVar20 +
                           dVar312 * dVar20 + dVar166 * dVar20 + dVar163 * dVar49 + dVar282) *
                         dVar124 * 0.007566670425467926 * dVar242 +
                         dVar258 * dVar20 * dVar252 +
                         dVar231 * 0.0183159137469788 * dVar241 * dVar158 * dVar199) -
                        dVar167 * 0.46513586984620986 * dVar78 * dVar123 * dVar199) +
                       dVar116 * dVar117 * dVar223 * 0.25) -
                      dVar83 * (dVar210 * dVar199 * -1.6419662276459916 +
                               dVar228 * dVar199 * 16.341819411519396 +
                               dVar193 * dVar199 * 6.537313195933369 +
                               dVar115 * dVar199 * -19.367359552567034) * 0.5) +
                      dVar195 * 0.060533363403743407 * dVar199 * dVar210 * dVar125 +
                      dVar118 * dVar20 * dVar162 +
                      dVar242 * dVar20 * dVar262 +
                      ((dVar160 * dVar199 +
                        dVar280 * dVar199 +
                        dVar320 * dVar199 +
                        dVar20 * dVar212 +
                        ((dVar50 * -12.1933728 +
                         ((dVar141 * 6.0966864 +
                          dVar202 * -6.0966864 + dVar49 * 54.0 + dVar38 * -12.1933728) -
                         dVar306 * 6.0966864)) * dVar289 + dVar271 * dVar20 + dVar122 * dVar20) *
                        dVar230 * 0.0026165591067112575 * dVar253 +
                        dVar301 * dVar20 +
                        (dVar72 * dVar20 + dVar159 * dVar20) * dVar161 * 0.5080572 * __x_05 +
                        dVar322 * dVar199 +
                       (dVar158 * dVar199 * -7.473256329443169 +
                       dVar78 * dVar199 * 21.087185174347326 +
                       dVar199 * 1.7059169152930056 + dVar157 * dVar199 * -12.48681162193212) *
                       3.141592653589793 * dVar82 * 0.5) - dVar223 * dVar86 * 0.5);
        }
        else {
          dVar199 = ((dVar156 * -0.6666666666666666 + dVar264 + dVar182) - dVar284) * 0.5080572;
          local_ef8 = dVar199 * dVar74 +
                      (((dVar156 * -1.4762117336394407 + dVar114 + dVar140) - dVar20) * dVar73 *
                       0.5080572 - dVar75 * dVar199);
        }
        dVar20 = exp(-__x_03);
        dVar199 = dVar191 * dVar139 * -6.4753871;
        dVar223 = dVar97 * 6.4753871 * dVar70 + dVar308 * dVar199;
        dVar43 = (1.0 / dVar26) * dVar43;
        dVar308 = (1.0 / dVar112) * dVar243 * dVar88;
        dVar97 = dVar67 * dVar87 + dVar67 * dVar87;
        dVar49 = (1.0 / dVar88) / (dVar243 * dVar243);
        dVar77 = dVar77 * -0.21875;
        dVar20 = dVar20 * dVar89 * 1.9940105822687055;
        if (dVar67 <= 0.08) {
          dVar37 = dVar67 * dVar235 * -0.14235295576 + dVar37 * 0.34138165292;
        }
        else {
          dVar37 = dVar126 * -3.7333333333333334 * dVar182 * dVar308 +
                   (dVar182 * (1.0 / dVar196) * dVar20 +
                   dVar140 * dVar89 * dVar21 * -2.3751029502456897 +
                   dVar182 * dVar49 * dVar77 +
                   (dVar243 * 24.3867456 * dVar182 +
                   __x_04 * dVar182 * -2.97366688 +
                   (dVar97 * dVar235 + dVar112 * dVar223) * -0.463292766 * __x_04 +
                   dVar168 * dVar182) * 1.7724538509055159 * dVar297 * 0.0625) * 0.5641895835477563
                   * -1.0666666666666667 * dVar110 + dVar126 * 2.1333333333333333 * dVar235 * dVar43
          ;
        }
        dVar140 = 1.0 / (dVar243 * dVar243);
        dVar106 = dVar67 * __x_04 * -0.154430922;
        dVar50 = dVar140 * dVar291;
        dVar140 = dVar90 * dVar140 * 1.3333333333333333;
        dVar316 = dVar316 * -0.2962962962962963;
        dVar246 = dVar173 * -0.2962962962962963 * dVar246;
        dVar144 = 0.0;
        if (dVar59 < local_e80) {
          dVar318 = dVar318 * dVar135;
          dVar310 = (dVar318 * -0.6666666666666666 + dVar182) - dVar58 * 0.2222222222222222;
          dVar205 = dVar112 * dVar310 * dVar87;
          dVar184 = dVar235 * dVar87 * __x_00 * dVar67;
          dVar144 = dVar235 * dVar127 * dVar67;
          dVar37 = dVar37 * dVar112;
          dVar144 = (dVar310 * dVar170 * dVar24 +
                    dVar182 * dVar50 * dVar246 +
                    (dVar144 + dVar144 + dVar37) * dVar311 * dVar174 * dVar283 +
                    ((dVar208 * dVar135 * dVar283 +
                     dVar310 * dVar219 * dVar304 * dVar251 +
                     dVar182 * dVar291 * dVar216 * dVar76 * dVar316 +
                     (dVar37 * 5.0 +
                     dVar144 * 10.0 +
                     dVar169 * dVar223 * -0.077215461 +
                     dVar184 * -0.154430922 +
                     dVar205 * -0.077215461 +
                     dVar58 * 0.017158991333333335 +
                     dVar318 * 0.051476974 +
                     (dVar38 * -0.154430922 - dVar202 * 0.077215461) + dVar141 * 0.077215461) *
                     dVar232 * dVar263 +
                     ((dVar272 * dVar135 * dVar291 * dVar304 +
                      dVar310 * dVar278 * dVar129 +
                      ((((dVar37 * 15.0 +
                         dVar144 * 30.0 +
                         dVar169 * dVar223 * -0.463292766 +
                         dVar184 * -0.926585532 +
                         dVar205 * -0.463292766 +
                         dVar58 * 0.102953948 +
                         dVar318 * 0.308861844 +
                         dVar141 * 0.463292766 +
                         dVar202 * -0.463292766 + dVar310 * dVar197 + dVar38 * -0.926585532) *
                         dVar25 * dVar153 * dVar155) / 27.0 +
                       (((dVar140 * dVar182 +
                         local_ef8 * -0.8888888888888888 +
                         (dVar37 + dVar37 +
                         dVar144 * 4.0 +
                         dVar223 * dVar128 +
                         dVar235 * dVar87 * dVar106 +
                         dVar112 * dVar182 * -0.077215461 * dVar87 +
                         ((__x_04 * dVar182 * -0.74341672 + dVar38 * -0.154430922) -
                         dVar202 * 0.077215461) + dVar141 * 0.077215461) * -0.4444444444444444 *
                         dVar76) - (dVar198 * dVar135 * dVar155) / 27.0) - dVar61)) -
                      (dVar182 * dVar263 * dVar91) / 27.0)) - dVar305)) - dVar265)) * dVar254 +
                    (dVar23 * (double)(~uVar18 & (ulong)(dVar22 * dVar267 * 1.3333333333333333)) *
                     -0.36927938319101117 * dVar175 - dVar189);
        }
        pdVar1 = out->vrho;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar7 = (long)(p->dim).vrho * sVar9;
          pdVar1[lVar7 + 1] = (dVar294 + dVar144) * __x_06 + local_aa8 + pdVar1[lVar7 + 1];
        }
        dVar29 = ((1.0 / dVar29) * dVar28 * dVar31) / 24.0;
        dVar22 = 0.0;
        if (dVar95 <= 15.0) {
          dVar22 = (double)(-(ulong)(1.0 < dVar32) & (ulong)dVar29);
          dVar22 = dVar22 - dVar34 * dVar22 * dVar217;
        }
        dVar29 = (double)(~-(ulong)(dVar35 < 1e-15) &
                         (~-(ulong)(dVar95 < 1.0) & (ulong)dVar22 |
                         (ulong)dVar29 & -(ulong)(dVar95 < 1.0)));
        dVar267 = dVar33 * dVar180 * dVar36 * dVar29;
        dVar255 = dVar255 * dVar29;
        dVar22 = dVar33 * dVar29 * 0.01959362 + dVar255 * 0.1643336;
        dVar198 = dVar96 * dVar22 * dVar36;
        dVar23 = dVar181 * dVar29 + dVar255 * 0.74976 + dVar222 * dVar29 * 0.0060412;
        dVar137 = dVar137 * dVar256 * dVar23;
        dVar235 = dVar137 * -2.214317600459161 +
                  dVar267 * 4.428635200918322 + dVar198 * 2.214317600459161;
        dVar135 = (dVar267 + dVar267 + dVar198) - dVar137;
        if (dVar27 <= 14.0) {
          dVar183 = dVar183 * dVar135;
          local_698 = dVar145 * (dVar143 * dVar135 - dVar102 * dVar135) * 0.5080572 * __x_02 +
                      dVar249 * dVar100 * dVar135 +
                      dVar146 * dVar270 * dVar135 +
                      (dVar248 * (dVar137 * -329.2210656 +
                                 dVar198 * 329.2210656 + dVar183 * -1458.0 + dVar267 * 658.4421312)
                      + dVar101 * dVar135 +
                        dVar302 * dVar135 + dVar313 * dVar183 + dVar150 * dVar135) * dVar204 *
                      0.007566670425467926 * dVar270 +
                      dVar225 * -0.006541397766778144 * dVar269 * dVar135 +
                      dVar39 * dVar296 * dVar135 +
                      dVar224 * (dVar268 * (dVar137 * 6.0966864 +
                                           dVar198 * -6.0966864 +
                                           dVar183 * 54.0 + dVar267 * -12.1933728) +
                                dVar295 * dVar135 + dVar259 * dVar135) * 0.0026165591067112575 *
                      dVar296 + (dVar203 * dVar135 +
                                dVar204 * dVar135 * -0.7525765385646315 +
                                dVar236 * (dVar137 * -79.7154336165298 +
                                          dVar267 * 159.4308672330596 + dVar198 * 79.7154336165298)
                                          * 0.007715016088131) * dVar142 +
                                dVar103 * dVar47 * dVar135 +
                                dVar237 * dVar303 * dVar135 +
                                dVar46 * (dVar51 * dVar135 * 6.19493084332416 +
                                         dVar247 * dVar135 +
                                         dVar260 * (dVar137 * -9.0 + dVar267 * 18.0 + dVar198 * 9.0)
                                         ) * -0.09302717396924197 * dVar303 +
                                (dVar147 * dVar135 + dVar148 * dVar135 * -0.9874852102547023) *
                                dVar45 + (dVar105 * dVar135 * -1.2394393902309044 + dVar48 * dVar135
                                         ) * dVar98 +
                                         dVar104 * dVar135 +
                                         dVar149 * dVar135 +
                                         dVar52 * dVar235 * -0.5 + dVar99 * dVar309 * dVar235 * 0.25
          ;
        }
        else {
          local_698 = dVar135 * 0.5080572 * dVar41 +
                      (dVar40 * dVar235 * 0.5080572 - dVar42 * dVar135 * 0.5080572);
        }
        dVar22 = dVar22 * 6.4753871 * dVar36 + dVar261 * dVar23;
        if (dVar33 <= 0.08) {
          dVar23 = dVar33 * dVar29 * -0.14235295576 + dVar255 * 0.34138165292;
        }
        else {
          dVar23 = dVar238 * -3.7333333333333334 * dVar285 * dVar135 +
                   (dVar30 * (1.0 / dVar185) * dVar135 +
                   dVar55 * dVar235 * -2.3751029502456897 * dVar136 +
                   dVar152 * dVar54 * dVar135 +
                   dVar287 * (dVar206 * 24.3867456 * dVar135 +
                             __x_01 * dVar135 * -2.97366688 +
                             (dVar92 * dVar29 + dVar96 * dVar22) * -0.463292766 * __x_01 +
                             dVar151 * dVar135) * 1.7724538509055159 * 0.0625) * 0.5641895835477563
                   * -1.0666666666666667 * dVar56 + dVar238 * 2.1333333333333333 * dVar107 * dVar29;
        }
        dVar27 = 0.0;
        if (dVar234 < dVar19) {
          dVar136 = dVar96 * dVar135 * dVar53;
          dVar19 = dVar250 * dVar33 * dVar29;
          dVar23 = dVar23 * dVar96;
          dVar234 = dVar136 * 0.077215461;
          dVar27 = dVar33 * __x * dVar53 * dVar29;
          auVar177._0_8_ =
               dVar209 * (dVar23 * 15.0 +
                         dVar19 * 30.0 +
                         dVar186 * dVar22 * -0.463292766 +
                         dVar27 * -0.926585532 +
                         dVar136 * -0.463292766 +
                         dVar137 * 0.463292766 +
                         dVar198 * -0.463292766 + dVar244 * dVar135 + dVar267 * -0.926585532) *
                         dVar25 * dVar94;
          auVar177._8_8_ = dVar221 * dVar135 * dVar84;
          auVar178 = divpd(auVar177,_DAT_00f77b90);
          dVar27 = dVar60 * (dVar229 * dVar279 * dVar135 +
                            dVar201 * dVar300 * dVar135 +
                            dVar190 * (dVar19 + dVar19 + dVar23) * dVar311 * dVar119 +
                            dVar239 * dVar93 * dVar307 * dVar135 +
                            dVar57 * dVar138 * dVar44 * dVar226 * dVar135 +
                            dVar81 * (dVar23 * 5.0 +
                                     dVar19 * 10.0 +
                                     dVar186 * dVar22 * -0.077215461 +
                                     dVar27 * -0.154430922 +
                                     (((dVar267 * -0.154430922 - dVar198 * 0.077215461) +
                                      dVar137 * 0.077215461) - dVar234)) * dVar84 +
                            dVar288 * dVar187 * dVar135 +
                            ((dVar200 * dVar135 +
                              local_698 * -0.8888888888888888 +
                              dVar44 * (dVar23 + dVar23 +
                                       dVar19 * 4.0 +
                                       dVar108 * dVar22 +
                                       dVar275 * dVar53 * dVar29 +
                                       ((((__x_01 * dVar135 * -0.74341672 + dVar267 * -0.154430922)
                                         - dVar198 * 0.077215461) + dVar137 * 0.077215461) - dVar234
                                       )) * -0.4444444444444444 + auVar178._0_8_) - auVar178._8_8_))
          ;
        }
        pdVar1 = out->vsigma;
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar7 = (long)(p->dim).vsigma * sVar9;
          pdVar1[lVar7] = dVar27 * __x_06 + pdVar1[lVar7];
          lVar7 = (long)(p->dim).vsigma * sVar9;
          pdVar1[lVar7 + 1] = pdVar1[lVar7 + 1] + 0.0;
        }
        dVar19 = (dVar28 * (1.0 / dVar63) * dVar65) / 24.0;
        dVar234 = 0.0;
        if (dVar111 <= 15.0) {
          dVar234 = (double)(-(ulong)(1.0 < dVar66) & (ulong)dVar19);
          dVar234 = dVar234 - dVar68 * dVar234 * dVar134;
        }
        dVar19 = (double)(~-(ulong)(dVar69 < 1e-15) &
                         (~-(ulong)(dVar111 < 1.0) & (ulong)dVar234 |
                         (ulong)dVar19 & -(ulong)(dVar111 < 1.0)));
        dVar27 = dVar67 * dVar191 * dVar70 * dVar19;
        dVar26 = dVar26 * dVar19;
        dVar28 = dVar67 * dVar19 * 0.01959362 + dVar26 * 0.1643336;
        dVar22 = dVar112 * dVar28 * dVar70;
        dVar234 = dVar179 * dVar19 + dVar26 * 0.74976 + dVar227 * dVar19 * 0.0060412;
        dVar154 = dVar154 * dVar139 * dVar234;
        dVar23 = dVar154 * -2.214317600459161 +
                 dVar27 * 4.428635200918322 + dVar22 * 2.214317600459161;
        dVar29 = (dVar27 + dVar27 + dVar22) - dVar154;
        if (dVar62 <= 14.0) {
          dVar194 = dVar194 * dVar29;
          local_6a8 = dVar161 * (dVar72 * dVar29 + dVar159 * dVar29) * 0.5080572 * __x_05 +
                      dVar162 * dVar118 * dVar29 +
                      dVar262 * dVar242 * dVar29 +
                      (dVar317 * (dVar154 * -329.2210656 +
                                 dVar22 * 329.2210656 + dVar194 * -1458.0 + dVar27 * 658.4421312) +
                      dVar121 * dVar29 + dVar312 * dVar29 + dVar163 * dVar194 + dVar166 * dVar29) *
                      dVar124 * 0.007566670425467926 * dVar242 +
                      dVar252 * dVar258 * dVar29 +
                      dVar211 * dVar253 * dVar29 +
                      dVar230 * (dVar289 * (dVar154 * 6.0966864 +
                                           dVar22 * -6.0966864 +
                                           dVar194 * 54.0 + dVar27 * -12.1933728) +
                                dVar271 * dVar29 + dVar122 * dVar29) * 0.0026165591067112575 *
                      dVar253 + (dVar120 * dVar29 +
                                dVar124 * dVar29 * -0.7525765385646315 +
                                dVar240 * (dVar154 * -79.7154336165298 +
                                          dVar27 * 159.4308672330596 + dVar22 * 79.7154336165298) *
                                          0.007715016088131) * dVar158 +
                                dVar213 * dVar245 * dVar29 +
                                dVar80 * dVar290 * dVar29 +
                                dVar79 * (dVar85 * dVar29 * 6.19493084332416 +
                                         dVar319 * dVar29 +
                                         dVar281 * (dVar154 * -9.0 + dVar27 * 18.0 + dVar22 * 9.0))
                                * -0.09302717396924197 * dVar290 +
                                (dVar277 * dVar29 + dVar164 * dVar29 * -0.9874852102547023) * dVar78
                                + (dVar123 * dVar29 * -1.2394393902309044 + dVar165 * dVar29) *
                                  dVar115 + dVar212 * dVar29 +
                                            dVar301 * dVar29 +
                                            dVar86 * dVar23 * -0.5 +
                                            dVar116 * dVar117 * dVar23 * 0.25;
        }
        else {
          local_6a8 = dVar29 * 0.5080572 * dVar74 +
                      (dVar73 * dVar23 * 0.5080572 - dVar75 * dVar29 * 0.5080572);
        }
        dVar234 = dVar28 * 6.4753871 * dVar70 + dVar199 * dVar234;
        if (dVar67 <= 0.08) {
          dVar20 = dVar67 * dVar19 * -0.14235295576 + dVar26 * 0.34138165292;
        }
        else {
          dVar20 = dVar126 * -3.7333333333333334 * dVar308 * dVar29 +
                   (dVar20 * (1.0 / dVar196) * dVar29 +
                   dVar89 * dVar23 * -2.3751029502456897 * dVar21 +
                   dVar77 * dVar49 * dVar29 +
                   dVar297 * (dVar243 * 24.3867456 * dVar29 +
                             __x_04 * dVar29 * -2.97366688 +
                             (dVar97 * dVar19 + dVar112 * dVar234) * -0.463292766 * __x_04 +
                             dVar168 * dVar29) * 1.7724538509055159 * 0.0625) * 0.5641895835477563 *
                   -1.0666666666666667 * dVar110 + dVar126 * 2.1333333333333333 * dVar43 * dVar19;
        }
        dVar21 = 0.0;
        if (dVar59 < local_e80) {
          dVar21 = dVar112 * dVar29 * dVar87;
          dVar28 = dVar127 * dVar67 * dVar19;
          dVar20 = dVar20 * dVar112;
          dVar23 = dVar21 * 0.077215461;
          dVar26 = __x_00 * dVar67 * dVar87 * dVar19;
          auVar133._0_8_ =
               dVar155 * dVar25 * (dVar20 * 15.0 +
                                  dVar28 * 30.0 +
                                  dVar169 * dVar234 * -0.463292766 +
                                  dVar26 * -0.926585532 +
                                  dVar21 * -0.463292766 +
                                  dVar154 * 0.463292766 +
                                  dVar22 * -0.463292766 + dVar197 * dVar29 + dVar27 * -0.926585532)
                         * dVar153;
          auVar133._8_8_ = dVar91 * dVar29 * dVar263;
          auVar178 = divpd(auVar133,_DAT_00f77b90);
          dVar21 = dVar254 * (dVar24 * dVar170 * dVar29 +
                             dVar246 * dVar50 * dVar29 +
                             dVar174 * dVar311 * (dVar28 + dVar28 + dVar20) * dVar283 +
                             dVar251 * dVar304 * dVar219 * dVar29 +
                             dVar316 * dVar216 * dVar76 * dVar291 * dVar29 +
                             dVar232 * (dVar20 * 5.0 +
                                       dVar28 * 10.0 +
                                       dVar169 * dVar234 * -0.077215461 +
                                       dVar26 * -0.154430922 +
                                       (((dVar27 * -0.154430922 - dVar22 * 0.077215461) +
                                        dVar154 * 0.077215461) - dVar23)) * dVar263 +
                             dVar129 * dVar278 * dVar29 +
                             ((dVar140 * dVar29 +
                               local_6a8 * -0.8888888888888888 +
                               dVar76 * (dVar20 + dVar20 +
                                        dVar28 * 4.0 +
                                        dVar128 * dVar234 +
                                        dVar106 * dVar87 * dVar19 +
                                        ((((__x_04 * dVar29 * -0.74341672 + dVar27 * -0.154430922) -
                                          dVar22 * 0.077215461) + dVar154 * 0.077215461) - dVar23))
                                        * -0.4444444444444444 + auVar178._0_8_) - auVar178._8_8_));
        }
        if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar7 = (long)(p->dim).vsigma * sVar9;
          pdVar1[lVar7 + 2] = __x_06 * dVar21 + pdVar1[lVar7 + 2];
        }
      }
      sVar9 = sVar9 + 1;
    } while (np != sVar9);
  }
  return;
}

Assistant:

static void
WORK_GGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, const double *sigma,
         xc_gga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};
  double my_sigma[3] = {0.0, 0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));
    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, out);
    
    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 %le 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(sigma, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le %le %le %le 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1),
                 VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2));
        }
      }
    }
#endif
  }   /* for(ip) */

}